

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

ComponentHandle<Direction,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Direction,int,int>(EntityManager *this,Id id,int *args,int *args_1)

{
  ComponentHandle<Direction,_entityx::EntityManager> CVar1;
  Pool<Direction,_8192UL> *pPVar2;
  char *pcVar3;
  Direction *this_00;
  int *in_RCX;
  int __c;
  int __c_00;
  int *in_RDX;
  Id in_RSI;
  ComponentHandle<Direction,_entityx::EntityManager> *in_RDI;
  Pool<Direction,_8192UL> *pool;
  Family family;
  ComponentHandle<Direction,_entityx::EntityManager> component;
  Id *this_01;
  BasePool *in_stack_ffffffffffffff70;
  vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *this_02;
  Entity local_60;
  EntityManager *in_stack_ffffffffffffffb0;
  ComponentHandle<Direction,_entityx::EntityManager> *args_1_00;
  Id id_00;
  EntityManager *in_stack_fffffffffffffff0;
  Id local_8;
  
  args_1_00 = in_RDI;
  id_00.id_ = in_RSI.id_;
  assert_valid((EntityManager *)in_RDI,in_RSI);
  component_family<Direction>();
  pPVar2 = accomodate_component<Direction>(in_stack_ffffffffffffffb0);
  this_01 = (Id *)&stack0xffffffffffffffe8;
  pcVar3 = Entity::Id::index(this_01,(char *)in_RSI.id_,__c);
  pcVar3 = (char *)((ulong)pcVar3 & 0xffffffff);
  this_00 = (Direction *)BasePool::get(in_stack_ffffffffffffff70,(size_t)this_01);
  Direction::Direction(this_00,(float)*in_RDX,(float)*in_RCX);
  this_02 = (vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *)&in_RDI[4].id_;
  pcVar3 = Entity::Id::index(this_01,pcVar3,__c_00);
  Catch::clara::std::vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>::operator[]
            (this_02,(ulong)pcVar3 & 0xffffffff);
  Catch::clara::std::bitset<64UL>::set
            ((bitset<64UL> *)this_02,(size_t)this_01,SUB81((ulong)pPVar2 >> 0x38,0));
  ComponentHandle<Direction,_entityx::EntityManager>::ComponentHandle
            ((ComponentHandle<Direction,_entityx::EntityManager> *)&stack0xfffffffffffffff0,
             (EntityManager *)in_RDI,id_00);
  Entity::Entity(&local_60,(EntityManager *)in_RDI,id_00);
  EventManager::
  emit<entityx::ComponentAddedEvent<Direction>,entityx::Entity,entityx::ComponentHandle<Direction,entityx::EntityManager>&>
            ((EventManager *)in_stack_fffffffffffffff0,(Entity *)id_00.id_,args_1_00);
  CVar1.id_.id_ = local_8.id_;
  CVar1.manager_ = in_stack_fffffffffffffff0;
  return CVar1;
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }